

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_isorr_bz2.c
# Opt level: O3

void test_read_format_isorr_bz2(void)

{
  int iVar1;
  wchar_t wVar2;
  int iVar3;
  mode_t mVar4;
  archive_conflict *paVar5;
  byte *pbVar6;
  char *pcVar7;
  long v2;
  time_t tVar8;
  la_int64_t lVar9;
  stat *psVar10;
  longlong v2_00;
  uint uVar11;
  archive_entry *ae;
  int64_t offset;
  size_t size;
  void *p;
  archive_entry *local_58;
  archive_conflict *local_50;
  longlong local_48;
  int local_40 [2];
  void *local_38;
  
  extract_reference_file("test_read_format_iso_rockridge.iso.Z");
  paVar5 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                   ,L'A',(uint)(paVar5 != (archive_conflict *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                      ,L'B',0,"0",(long)iVar1,"archive_read_support_filter_all(a)",(void *)0x0);
  iVar1 = archive_read_support_format_all((archive *)paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                      ,L'C',0,"0",(long)iVar1,"archive_read_support_format_all(a)",(void *)0x0);
  local_50 = paVar5;
  wVar2 = archive_read_open_filename(paVar5,"test_read_format_iso_rockridge.iso.Z",0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                      ,L'E',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",(void *)0x0);
  iVar1 = 10;
  do {
    paVar5 = local_50;
    iVar3 = archive_read_next_header((archive *)local_50,&local_58);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                        ,L'J',0,"0",(long)iVar3,"archive_read_next_header(a, &ae)",(void *)0x0);
    wVar2 = archive_entry_is_encrypted(local_58);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                        ,L'L',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar3 = archive_read_has_encrypted_entries((archive *)paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                        ,L'M',(long)iVar3,"archive_read_has_encrypted_entries(a)",-2,
                        "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar5);
    pbVar6 = (byte *)archive_entry_pathname(local_58);
    uVar11 = *pbVar6 - 0x2e;
    if (uVar11 == 0) {
      uVar11 = (uint)pbVar6[1];
    }
    if (uVar11 == 0) {
      mVar4 = archive_entry_filetype(local_58);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                          ,L'Q',0x4000,"AE_IFDIR",(ulong)mVar4,"archive_entry_filetype(ae)",
                          (void *)0x0);
      lVar9 = archive_entry_size(local_58);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                          ,L'R',0x800,"2048",lVar9,"archive_entry_size(ae)",(void *)0x0);
      tVar8 = archive_entry_mtime(local_58);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                          ,L'T',0x15181,"86401",tVar8,"archive_entry_mtime(ae)",(void *)0x0);
      v2 = archive_entry_mtime_nsec(local_58);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                          ,L'U',0,"0",v2,"archive_entry_mtime_nsec(ae)",(void *)0x0);
      psVar10 = archive_entry_stat((archive_entry_conflict *)local_58);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                          ,L'W',3,"3",psVar10->st_nlink,"archive_entry_stat(ae)->st_nlink",
                          (void *)0x0);
      lVar9 = archive_entry_uid(local_58);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                          ,L'X',1,"1",lVar9,"archive_entry_uid(ae)",(void *)0x0);
      paVar5 = local_50;
      iVar3 = archive_read_data_block((archive *)local_50,&local_38,(size_t *)local_40,&local_48);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                          ,L'Z',1,"ARCHIVE_EOF",(long)iVar3,
                          "archive_read_data_block(a, &p, &size, &offset)",paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                          ,L'[',(long)local_40[0],"(int)size",0,"0",(void *)0x0);
    }
    else {
      pcVar7 = archive_entry_pathname(local_58);
      iVar3 = strcmp("dir",pcVar7);
      pcVar7 = archive_entry_pathname(local_58);
      if (iVar3 == 0) {
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                   ,L'^',"dir","\"dir\"",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
        mVar4 = archive_entry_filetype(local_58);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                            ,L'_',0x4000,"AE_IFDIR",(ulong)mVar4,"archive_entry_filetype(ae)",
                            (void *)0x0);
        lVar9 = archive_entry_size(local_58);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                            ,L'`',0x800,"2048",lVar9,"archive_entry_size(ae)",(void *)0x0);
        tVar8 = archive_entry_mtime(local_58);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                            ,L'a',0x15181,"86401",tVar8,"archive_entry_mtime(ae)",(void *)0x0);
        tVar8 = archive_entry_atime(local_58);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                            ,L'b',0x15181,"86401",tVar8,"archive_entry_atime(ae)",(void *)0x0);
        psVar10 = archive_entry_stat((archive_entry_conflict *)local_58);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                            ,L'c',2,"2",psVar10->st_nlink,"archive_entry_stat(ae)->st_nlink",
                            (void *)0x0);
        lVar9 = archive_entry_uid(local_58);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                            ,L'd',1,"1",lVar9,"archive_entry_uid(ae)",(void *)0x0);
        lVar9 = archive_entry_gid(local_58);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                            ,L'e',2,"2",lVar9,"archive_entry_gid(ae)",(void *)0x0);
      }
      else {
        iVar3 = strcmp("file",pcVar7);
        pcVar7 = archive_entry_pathname(local_58);
        if (iVar3 == 0) {
          assertion_equal_string
                    ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                     ,L'h',"file","\"file\"",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
          mVar4 = archive_entry_filetype(local_58);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                              ,L'i',0x8000,"AE_IFREG",(ulong)mVar4,"archive_entry_filetype(ae)",
                              (void *)0x0);
          lVar9 = archive_entry_size(local_58);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                              ,L'j',0xbc6154,"12345684",lVar9,"archive_entry_size(ae)",(void *)0x0);
          iVar3 = archive_read_data_block
                            ((archive *)local_50,&local_38,(size_t *)local_40,&local_48);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                              ,L'l',0,"0",(long)iVar3,
                              "archive_read_data_block(a, &p, &size, &offset)",(void *)0x0);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                              ,L'm',0,"0",local_48,"offset",(void *)0x0);
          assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                              ,L'n',local_38,"p","hello\n","\"hello\\n\"",6,"6",(void *)0x0);
          tVar8 = archive_entry_mtime(local_58);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                              ,L'o',0x15181,"86401",tVar8,"archive_entry_mtime(ae)",(void *)0x0);
          tVar8 = archive_entry_atime(local_58);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                              ,L'p',0x15181,"86401",tVar8,"archive_entry_atime(ae)",(void *)0x0);
          psVar10 = archive_entry_stat((archive_entry_conflict *)local_58);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                              ,L'q',2,"2",psVar10->st_nlink,"archive_entry_stat(ae)->st_nlink",
                              (void *)0x0);
          lVar9 = archive_entry_uid(local_58);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                              ,L'r',1,"1",lVar9,"archive_entry_uid(ae)",(void *)0x0);
          v2_00 = archive_entry_gid(local_58);
          wVar2 = L's';
        }
        else {
          iVar3 = strcmp("hardlink",pcVar7);
          pcVar7 = archive_entry_pathname(local_58);
          if (iVar3 == 0) {
            assertion_equal_string
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                       ,L'{',"hardlink","\"hardlink\"",pcVar7,"archive_entry_pathname(ae)",
                       (void *)0x0,L'\0');
            mVar4 = archive_entry_filetype(local_58);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                ,L'|',0x8000,"AE_IFREG",(ulong)mVar4,"archive_entry_filetype(ae)",
                                (void *)0x0);
            pcVar7 = archive_entry_hardlink(local_58);
            assertion_equal_string
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                       ,L'}',"file","\"file\"",pcVar7,"archive_entry_hardlink(ae)",(void *)0x0,L'\0'
                      );
            wVar2 = archive_entry_size_is_set(local_58);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                ,L'~',0,"0",(long)wVar2,"archive_entry_size_is_set(ae)",(void *)0x0)
            ;
            lVar9 = archive_entry_size(local_58);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                ,L'\x7f',0,"0",lVar9,"archive_entry_size(ae)",(void *)0x0);
            tVar8 = archive_entry_mtime(local_58);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                ,L'\x80',0x15181,"86401",tVar8,"archive_entry_mtime(ae)",(void *)0x0
                               );
            tVar8 = archive_entry_atime(local_58);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                ,L'\x81',0x15181,"86401",tVar8,"archive_entry_atime(ae)",(void *)0x0
                               );
            psVar10 = archive_entry_stat((archive_entry_conflict *)local_58);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                ,L'\x82',2,"2",psVar10->st_nlink,"archive_entry_stat(ae)->st_nlink",
                                (void *)0x0);
            lVar9 = archive_entry_uid(local_58);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                ,L'\x83',1,"1",lVar9,"archive_entry_uid(ae)",(void *)0x0);
            v2_00 = archive_entry_gid(local_58);
            wVar2 = L'\x84';
          }
          else {
            iVar3 = strcmp("symlink",pcVar7);
            if (iVar3 == 0) {
              mVar4 = archive_entry_filetype(local_58);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                  ,L'\x87',0xa000,"AE_IFLNK",(ulong)mVar4,
                                  "archive_entry_filetype(ae)",(void *)0x0);
              pcVar7 = archive_entry_symlink(local_58);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                         ,L'\x88',"file","\"file\"",pcVar7,"archive_entry_symlink(ae)",(void *)0x0,
                         L'\0');
              lVar9 = archive_entry_size(local_58);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                  ,L'\x89',0,"0",lVar9,"archive_entry_size(ae)",(void *)0x0);
              tVar8 = archive_entry_mtime(local_58);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                  ,L'\x8a',0x2a302,"172802",tVar8,"archive_entry_mtime(ae)",
                                  (void *)0x0);
              tVar8 = archive_entry_atime(local_58);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                  ,L'\x8b',0x2a302,"172802",tVar8,"archive_entry_atime(ae)",
                                  (void *)0x0);
              psVar10 = archive_entry_stat((archive_entry_conflict *)local_58);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                  ,L'\x8c',1,"1",psVar10->st_nlink,
                                  "archive_entry_stat(ae)->st_nlink",(void *)0x0);
              lVar9 = archive_entry_uid(local_58);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                  ,L'\x8d',1,"1",lVar9,"archive_entry_uid(ae)",(void *)0x0);
              v2_00 = archive_entry_gid(local_58);
              wVar2 = L'\x8e';
            }
            else {
              pcVar7 = archive_entry_pathname(local_58);
              iVar3 = strcmp("symlink2",pcVar7);
              if (iVar3 == 0) {
                mVar4 = archive_entry_filetype(local_58);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                    ,L'\x91',0xa000,"AE_IFLNK",(ulong)mVar4,
                                    "archive_entry_filetype(ae)",(void *)0x0);
                pcVar7 = archive_entry_symlink(local_58);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                           ,L'\x92',"/tmp","\"/tmp\"",pcVar7,"archive_entry_symlink(ae)",(void *)0x0
                           ,L'\0');
                lVar9 = archive_entry_size(local_58);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                    ,L'\x93',0,"0",lVar9,"archive_entry_size(ae)",(void *)0x0);
                psVar10 = archive_entry_stat((archive_entry_conflict *)local_58);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                    ,L'\x94',1,"1",psVar10->st_nlink,
                                    "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                lVar9 = archive_entry_uid(local_58);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                    ,L'\x95',1,"1",lVar9,"archive_entry_uid(ae)",(void *)0x0);
                v2_00 = archive_entry_gid(local_58);
                wVar2 = L'\x96';
              }
              else {
                pcVar7 = archive_entry_pathname(local_58);
                iVar3 = strcmp("symlink3",pcVar7);
                if (iVar3 == 0) {
                  mVar4 = archive_entry_filetype(local_58);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                      ,L'\x99',0xa000,"AE_IFLNK",(ulong)mVar4,
                                      "archive_entry_filetype(ae)",(void *)0x0);
                  pcVar7 = archive_entry_symlink(local_58);
                  assertion_equal_string
                            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                             ,L'\x9a',"/tmp/..","\"/tmp/..\"",pcVar7,"archive_entry_symlink(ae)",
                             (void *)0x0,L'\0');
                  lVar9 = archive_entry_size(local_58);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                      ,L'\x9b',0,"0",lVar9,"archive_entry_size(ae)",(void *)0x0);
                  psVar10 = archive_entry_stat((archive_entry_conflict *)local_58);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                      ,L'\x9c',1,"1",psVar10->st_nlink,
                                      "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                  lVar9 = archive_entry_uid(local_58);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                      ,L'\x9d',1,"1",lVar9,"archive_entry_uid(ae)",(void *)0x0);
                  v2_00 = archive_entry_gid(local_58);
                  wVar2 = L'\x9e';
                }
                else {
                  pcVar7 = archive_entry_pathname(local_58);
                  iVar3 = strcmp("symlink4",pcVar7);
                  if (iVar3 == 0) {
                    mVar4 = archive_entry_filetype(local_58);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                        ,L'¡',0xa000,"AE_IFLNK",(ulong)mVar4,
                                        "archive_entry_filetype(ae)",(void *)0x0);
                    pcVar7 = archive_entry_symlink(local_58);
                    assertion_equal_string
                              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                               ,L'£',".././../tmp","\".././../tmp\"",pcVar7,
                               "archive_entry_symlink(ae)",(void *)0x0,L'\0');
                    lVar9 = archive_entry_size(local_58);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                        ,L'¤',0,"0",lVar9,"archive_entry_size(ae)",(void *)0x0);
                    psVar10 = archive_entry_stat((archive_entry_conflict *)local_58);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                        ,L'¥',1,"1",psVar10->st_nlink,
                                        "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                    lVar9 = archive_entry_uid(local_58);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                        ,L'¦',1,"1",lVar9,"archive_entry_uid(ae)",(void *)0x0);
                    v2_00 = archive_entry_gid(local_58);
                    wVar2 = L'§';
                  }
                  else {
                    pcVar7 = archive_entry_pathname(local_58);
                    iVar3 = strcmp("symlink5",pcVar7);
                    if (iVar3 == 0) {
                      mVar4 = archive_entry_filetype(local_58);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                          ,L'ª',0xa000,"AE_IFLNK",(ulong)mVar4,
                                          "archive_entry_filetype(ae)",(void *)0x0);
                      pcVar7 = archive_entry_symlink(local_58);
                      assertion_equal_string
                                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                 ,L'«',".///file","\".///file\"",pcVar7,"archive_entry_symlink(ae)"
                                 ,(void *)0x0,L'\0');
                      lVar9 = archive_entry_size(local_58);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                          ,L'¬',0,"0",lVar9,"archive_entry_size(ae)",(void *)0x0);
                      tVar8 = archive_entry_mtime(local_58);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                          ,L'­',0x2a302,"172802",tVar8,"archive_entry_mtime(ae)",
                                          (void *)0x0);
                      tVar8 = archive_entry_atime(local_58);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                          ,L'®',0x2a302,"172802",tVar8,"archive_entry_atime(ae)",
                                          (void *)0x0);
                      psVar10 = archive_entry_stat((archive_entry_conflict *)local_58);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                          ,L'¯',1,"1",psVar10->st_nlink,
                                          "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                      lVar9 = archive_entry_uid(local_58);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                          ,L'°',1,"1",lVar9,"archive_entry_uid(ae)",(void *)0x0);
                      v2_00 = archive_entry_gid(local_58);
                      wVar2 = L'±';
                    }
                    else {
                      pcVar7 = archive_entry_pathname(local_58);
                      iVar3 = strcmp("symlink6",pcVar7);
                      if (iVar3 != 0) {
                        failure("Saw a file that shouldn\'t have been there");
                        pcVar7 = archive_entry_pathname(local_58);
                        assertion_equal_string
                                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                   ,L'½',pcVar7,"archive_entry_pathname(ae)","","\"\"",(void *)0x0,
                                   L'\0');
                        goto LAB_00174478;
                      }
                      mVar4 = archive_entry_filetype(local_58);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                          ,L'µ',0xa000,"AE_IFLNK",(ulong)mVar4,
                                          "archive_entry_filetype(ae)",(void *)0x0);
                      pcVar7 = archive_entry_symlink(local_58);
                      assertion_equal_string
                                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                 ,L'¶',"/tmp//..","\"/tmp//..\"",pcVar7,"archive_entry_symlink(ae)"
                                 ,(void *)0x0,L'\0');
                      lVar9 = archive_entry_size(local_58);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                          ,L'·',0,"0",lVar9,"archive_entry_size(ae)",(void *)0x0);
                      psVar10 = archive_entry_stat((archive_entry_conflict *)local_58);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                          ,L'¸',1,"1",psVar10->st_nlink,
                                          "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                      lVar9 = archive_entry_uid(local_58);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                                          ,L'¹',1,"1",lVar9,"archive_entry_uid(ae)",(void *)0x0);
                      v2_00 = archive_entry_gid(local_58);
                      wVar2 = L'º';
                    }
                  }
                }
              }
            }
          }
        }
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                            ,wVar2,2,"2",v2_00,"archive_entry_gid(ae)",(void *)0x0);
      }
    }
LAB_00174478:
    paVar5 = local_50;
    iVar1 = iVar1 + -1;
    if (iVar1 == 0) {
      iVar1 = archive_read_next_header((archive *)local_50,&local_58);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                          ,L'Â',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          (void *)0x0);
      iVar1 = archive_filter_code((archive *)paVar5,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                          ,L'Å',(long)iVar1,"archive_filter_code(a, 0)",3,"ARCHIVE_FILTER_COMPRESS"
                          ,(void *)0x0);
      iVar1 = archive_format((archive *)paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                          ,L'Æ',(long)iVar1,"archive_format(a)",0x40001,
                          "ARCHIVE_FORMAT_ISO9660_ROCKRIDGE",(void *)0x0);
      iVar1 = archive_read_close((archive *)paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                          ,L'É',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar5);
      iVar1 = archive_read_free((archive *)paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_bz2.c"
                          ,L'Ê',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      return;
    }
  } while( true );
}

Assistant:

DEFINE_TEST(test_read_format_isorr_bz2)
{
	const char *refname = "test_read_format_iso_rockridge.iso.Z";
	struct archive_entry *ae;
	struct archive *a;
	const void *p;
	size_t size;
	int64_t offset;
	int i;

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualInt(0, archive_read_support_filter_all(a));
	assertEqualInt(0, archive_read_support_format_all(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Retrieve each of the 8 files on the ISO image and
	 * verify that each one is what we expect. */
	for (i = 0; i < 10; ++i) {
		assertEqualInt(0, archive_read_next_header(a, &ae));
		
		assertEqualInt(archive_entry_is_encrypted(ae), 0);
		assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

		if (strcmp(".", archive_entry_pathname(ae)) == 0) {
			/* '.' root directory. */
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			/* Now, we read timestamp recorded by RRIP "TF". */ 
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(0, archive_entry_mtime_nsec(ae));
			/* Now, we read links recorded by RRIP "PX". */ 
			assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualIntA(a, ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
		} else if (strcmp("dir", archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualString("dir", archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(2, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("file", archive_entry_pathname(ae)) == 0) {
			/* A regular file. */
			assertEqualString("file", archive_entry_pathname(ae));
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualInt(12345684, archive_entry_size(ae));
			assertEqualInt(0,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt(0, offset);
			assertEqualMem(p, "hello\n", 6);
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(2, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("hardlink", archive_entry_pathname(ae)) == 0) {
			/* A hardlink to the regular file. */
			/* Note: If "hardlink" gets returned before "file",
			 * then "hardlink" will get returned as a regular file
			 * and "file" will get returned as the hardlink.
			 * This test should tolerate that, since it's a
			 * perfectly permissible thing for libarchive to do. */
			assertEqualString("hardlink", archive_entry_pathname(ae));
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualString("file", archive_entry_hardlink(ae));
			assertEqualInt(0, archive_entry_size_is_set(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(2, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("symlink", archive_entry_pathname(ae)) == 0) {
			/* A symlink to the regular file. */
			assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
			assertEqualString("file", archive_entry_symlink(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(172802, archive_entry_mtime(ae));
			assertEqualInt(172802, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("symlink2", archive_entry_pathname(ae)) == 0) {
			/* A symlink to /tmp (an absolute path) */
			assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
			assertEqualString("/tmp", archive_entry_symlink(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("symlink3", archive_entry_pathname(ae)) == 0) {
			/* A symlink to /tmp/.. (with a ".." component) */
			assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
			assertEqualString("/tmp/..", archive_entry_symlink(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("symlink4", archive_entry_pathname(ae)) == 0) {
			/* A symlink to a path with ".." and "." components */
			assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
			assertEqualString(".././../tmp",
			    archive_entry_symlink(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("symlink5", archive_entry_pathname(ae)) == 0) {
			/* A symlink to the regular file with "/" components. */
			assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
			assertEqualString(".///file", archive_entry_symlink(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(172802, archive_entry_mtime(ae));
			assertEqualInt(172802, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("symlink6", archive_entry_pathname(ae)) == 0) {
			/* A symlink to /tmp//..
			 * (with "/" and ".." components) */
			assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
			assertEqualString("/tmp//..", archive_entry_symlink(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else {
			failure("Saw a file that shouldn't have been there");
			assertEqualString(archive_entry_pathname(ae), "");
		}
	}

	/* End of archive. */
	assertEqualInt(ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_COMPRESS);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_ISO9660_ROCKRIDGE);

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}